

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_util.c
# Opt level: O3

char * nbt_error_to_string(nbt_status s)

{
  if ((uint)(s + 4) < 5) {
    return &DAT_00106b0c + *(int *)(&DAT_00106b0c + (ulong)(uint)(s + 4) * 4);
  }
  return "Unknown error.";
}

Assistant:

const char* nbt_error_to_string(nbt_status s)
{
    switch(s)
    {
    case NBT_OK:
        return "No error.";
    case NBT_ERR:
        return "NBT tree is corrupt.";
    case NBT_EMEM:
        return "Out of memory. You should buy some RAM.";
    case NBT_EIO:
        return "IO Error. Nonexistant/corrupt file?";
    case NBT_EZ:
        return "Fatal zlib error. Corrupt file?";
    default:
        return "Unknown error.";
    }
}